

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCoveredByIndex(Expr *pExpr,int iCur,Index *pIdx)

{
  IdxCover xcov;
  Index *local_48;
  int local_40;
  Walker local_38;
  
  local_38.u.pNC = (NameContext *)&local_48;
  local_38.walkerDepth = 0;
  local_38.eCode = '\0';
  local_38._37_3_ = 0;
  local_38.pParse = (Parse *)0x0;
  local_38.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_38.xExprCallback = exprIdxCover;
  local_48 = pIdx;
  local_40 = iCur;
  sqlite3WalkExpr(&local_38,pExpr);
  return (uint)(local_38.eCode == '\0');
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCoveredByIndex(
  Expr *pExpr,        /* The index to be tested */
  int iCur,           /* The cursor number for the corresponding table */
  Index *pIdx         /* The index that might be used for coverage */
){
  Walker w;
  struct IdxCover xcov;
  memset(&w, 0, sizeof(w));
  xcov.iCur = iCur;
  xcov.pIdx = pIdx;
  w.xExprCallback = exprIdxCover;
  w.u.pIdxCover = &xcov;
  sqlite3WalkExpr(&w, pExpr);
  return !w.eCode;
}